

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int nodeVPush(xmlValidCtxtPtr ctxt,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = ctxt->nodeMax;
  if (iVar1 <= ctxt->nodeNr) {
    if (iVar1 < 1) {
      uVar4 = 4;
    }
    else {
      uVar4 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        uVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          uVar4 = 1000000000;
        }
      }
    }
    if (((int)uVar4 < 0) ||
       (ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(ulong)uVar4 << 3),
       ppxVar2 == (xmlNodePtr *)0x0)) {
      xmlVErrMemory(ctxt);
      return -1;
    }
    ctxt->nodeTab = ppxVar2;
    ctxt->nodeMax = uVar4;
  }
  iVar1 = ctxt->nodeNr;
  ctxt->nodeTab[iVar1] = value;
  ctxt->node = value;
  ctxt->nodeNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
nodeVPush(xmlValidCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nodeMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlVErrMemory(ctxt);
            return (-1);
        }
        tmp = xmlRealloc(ctxt->nodeTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlVErrMemory(ctxt);
            return (-1);
        }
	ctxt->nodeTab = tmp;
        ctxt->nodeMax = newSize;
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}